

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<1,_2,_13,_0,_1>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  long lVar2;
  int row;
  long lVar3;
  long lVar4;
  undefined4 uVar5;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Mat4 m;
  float afStack_110 [6];
  float local_f8 [4];
  float local_e8 [2];
  ulong local_e0;
  undefined4 local_d8;
  float local_d0 [4];
  float local_c0 [4];
  float local_b0 [6];
  Matrix<float,_4,_4> local_98;
  Matrix<float,_4,_4> local_58;
  
  pfVar1 = (float *)&local_58;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar5 = 0x3f800000;
      if (lVar2 != lVar4) {
        uVar5 = 0;
      }
      *(undefined4 *)((long)pfVar1 + lVar4) = uVar5;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    lVar2 = lVar2 + 0x10;
  } while (lVar3 != 4);
  local_58.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
  local_58.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
  local_58.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
  local_58.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  local_58.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  local_58.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  local_58.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
  local_58.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  afStack_110[0] = 4.366979e-39;
  afStack_110[1] = 0.0;
  tcu::operator-(&local_98,&local_58,-0.2);
  local_b0[0] = local_98.m_data.m_data[0].m_data[0];
  local_b0[1] = local_98.m_data.m_data[0].m_data[1];
  local_b0[2] = local_98.m_data.m_data[0].m_data[2];
  local_c0[0] = local_98.m_data.m_data[1].m_data[1];
  local_c0[1] = local_98.m_data.m_data[1].m_data[2];
  local_c0[2] = local_98.m_data.m_data[1].m_data[3];
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[2] = 0.0;
  lVar2 = 0;
  do {
    local_f8[lVar2] = local_b0[lVar2] + local_c0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_d0[0] = local_98.m_data.m_data[2].m_data[2];
  local_d0[1] = local_98.m_data.m_data[2].m_data[3];
  local_d0[2] = local_98.m_data.m_data[2].m_data[0];
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e0 = local_e0 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    local_e8[lVar2] = local_f8[lVar2] + local_d0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_b0[3] = local_98.m_data.m_data[3].m_data[3];
  local_b0[4] = local_98.m_data.m_data[3].m_data[0];
  local_b0[5] = local_98.m_data.m_data[3].m_data[1];
  afStack_110[2] = 0.0;
  afStack_110[3] = 0.0;
  afStack_110[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_110[lVar2 + 2] = local_e8[lVar2] + local_b0[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_e0 = 0x100000000;
  local_d8 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_e8[lVar2]] = afStack_110[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) - getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}